

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statements.cpp
# Opt level: O3

void __thiscall hsql::CreateStatement::~CreateStatement(CreateStatement *this)

{
  pointer ppCVar1;
  pointer ppcVar2;
  vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *__range2;
  vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *pvVar3;
  vector<char_*,_std::allocator<char_*>_> *pvVar4;
  pointer ppCVar5;
  pointer ppcVar6;
  
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__CreateStatement_0012b920;
  free(this->filePath);
  free(this->tableName);
  if (this->select != (SelectStatement *)0x0) {
    (*(this->select->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  pvVar3 = this->columns;
  if (pvVar3 != (vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *)0x0)
  {
    ppCVar5 = (pvVar3->
              super__Vector_base<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppCVar1 = (pvVar3->
              super__Vector_base<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar5 == ppCVar1) {
LAB_0010dd82:
      if (ppCVar5 != (pointer)0x0) {
        operator_delete(ppCVar5);
      }
    }
    else {
      do {
        if (*ppCVar5 != (ColumnDefinition *)0x0) {
          (*(*ppCVar5)->_vptr_ColumnDefinition[1])();
        }
        ppCVar5 = ppCVar5 + 1;
      } while (ppCVar5 != ppCVar1);
      pvVar3 = this->columns;
      if (pvVar3 != (vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *)
                    0x0) {
        ppCVar5 = (pvVar3->
                  super__Vector_base<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        goto LAB_0010dd82;
      }
      pvVar3 = (vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *)0x0;
    }
    operator_delete(pvVar3);
  }
  pvVar4 = this->viewColumns;
  if (pvVar4 == (vector<char_*,_std::allocator<char_*>_> *)0x0) {
    return;
  }
  ppcVar6 = (pvVar4->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar2 = (pvVar4->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar6 != ppcVar2) {
    do {
      free(*ppcVar6);
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 != ppcVar2);
    pvVar4 = this->viewColumns;
    if (pvVar4 == (vector<char_*,_std::allocator<char_*>_> *)0x0) {
      pvVar4 = (vector<char_*,_std::allocator<char_*>_> *)0x0;
      goto LAB_0010ddec;
    }
    ppcVar6 = (pvVar4->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar6 != (pointer)0x0) {
    operator_delete(ppcVar6);
  }
LAB_0010ddec:
  operator_delete(pvVar4);
  return;
}

Assistant:

CreateStatement::~CreateStatement() {
    free(filePath);
    free(tableName);
    delete select;

    if (columns != NULL) {
      for (ColumnDefinition* def : *columns) {
        delete def;
      }
      delete columns;
    }

    if (viewColumns != NULL) {
      for (char* column : *viewColumns) {
        free(column);
      }
      delete viewColumns;
    }
  }